

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void Catch::Colour::use(Code _colourCode)

{
  int iVar1;
  
  if (use(Catch::Colour::Code)::impl == '\0') {
    iVar1 = __cxa_guard_acquire(&use(Catch::Colour::Code)::impl);
    if (iVar1 != 0) {
      use::impl = anon_unknown_1::platformColourInstance();
      __cxa_guard_release(&use(Catch::Colour::Code)::impl);
    }
  }
  if (use::impl != (IColourImpl *)0x0) {
    (**(code **)(*(long *)use::impl + 0x10))(use::impl,_colourCode);
    return;
  }
  return;
}

Assistant:

void Colour::use(Code _colourCode) {
    static IColourImpl *impl = platformColourInstance();
    // Strictly speaking, this cannot possibly happen.
    // However, under some conditions it does happen (see #1626),
    // and this change is small enough that we can let practicality
    // triumph over purity in this case.
    if (impl != nullptr) {
      impl->use(_colourCode);
    }
  }